

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptAsyncFromSyncIterator * __thiscall
Js::JavascriptLibrary::CreateAsyncFromSyncIterator
          (JavascriptLibrary *this,RecyclableObject *syncIterator)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar3;
  Recycler *pRVar4;
  JavascriptAsyncFromSyncIterator *this_02;
  TrackAllocData local_48;
  DynamicType *local_20;
  DynamicType *type;
  RecyclableObject *syncIterator_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)syncIterator;
  syncIterator_local = (RecyclableObject *)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19a4,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = CreateAsyncFromSyncIteratorType(this);
  pRVar4 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&JavascriptAsyncFromSyncIterator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19a8);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_48);
  this_02 = (JavascriptAsyncFromSyncIterator *)new<Memory::Recycler>(0x30,pRVar4,0x43c4b0);
  JavascriptAsyncFromSyncIterator::JavascriptAsyncFromSyncIterator
            (this_02,local_20,(RecyclableObject *)type);
  return this_02;
}

Assistant:

JavascriptAsyncFromSyncIterator* JavascriptLibrary::CreateAsyncFromSyncIterator(RecyclableObject* syncIterator)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());

        DynamicType* type = CreateAsyncFromSyncIteratorType();

        return RecyclerNew(this->GetRecycler(), JavascriptAsyncFromSyncIterator, type, syncIterator);
    }